

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_87c1cb::ExternalPartitionTestDfsAPI::~ExternalPartitionTestDfsAPI
          (ExternalPartitionTestDfsAPI *this)

{
  libaom_test::EncoderTest::~EncoderTest((EncoderTest *)0x74d02c);
  libaom_test::CodecTestWith2Params<libaom_test::TestMode,_int>::~CodecTestWith2Params
            ((CodecTestWith2Params<libaom_test::TestMode,_int> *)0x74d036);
  return;
}

Assistant:

~ExternalPartitionTestDfsAPI() override = default;